

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

int64_t wallet::GetOldestKeyTimeInPool
                  (set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool,WalletBatch *batch)

{
  bool bVar1;
  reference plVar2;
  runtime_error *this;
  int64_t in_RSI;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  int64_t nIndex;
  CKeyPool keypool;
  CKeyPool *in_stack_ffffffffffffff08;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CKeyPool *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_78 [32];
  int64_t local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_ffffffffffffff08)
  ;
  if (bVar1) {
    local_58 = GetTime();
  }
  else {
    CKeyPool::CKeyPool(in_stack_ffffffffffffff08);
    std::set<long,_std::less<long>,_std::allocator<long>_>::begin(in_stack_ffffffffffffff10);
    plVar2 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)in_stack_ffffffffffffff08);
    bVar1 = WalletBatch::ReadPool((WalletBatch *)*plVar2,in_RSI,in_stack_ffffffffffffff30);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI);
      std::operator+(__lhs,(char *)this);
      std::runtime_error::runtime_error(this,local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0166be1e;
    }
    bVar1 = CPubKey::IsValid((CPubKey *)in_stack_ffffffffffffff08);
    if (!bVar1) {
      __assert_fail("keypool.vchPubKey.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x225,
                    "int64_t wallet::GetOldestKeyTimeInPool(const std::set<int64_t> &, WalletBatch &)"
                   );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_58;
  }
LAB_0166be1e:
  __stack_chk_fail();
}

Assistant:

static int64_t GetOldestKeyTimeInPool(const std::set<int64_t>& setKeyPool, WalletBatch& batch) {
    if (setKeyPool.empty()) {
        return GetTime();
    }

    CKeyPool keypool;
    int64_t nIndex = *(setKeyPool.begin());
    if (!batch.ReadPool(nIndex, keypool)) {
        throw std::runtime_error(std::string(__func__) + ": read oldest key in keypool failed");
    }
    assert(keypool.vchPubKey.IsValid());
    return keypool.nTime;
}